

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview_p.h
# Opt level: O0

void __thiscall
QHeaderViewPrivate::saveCascadingSectionSize(QHeaderViewPrivate *this,int visual,int size)

{
  bool bVar1;
  int *piVar2;
  QHash<int,_int> *in_RDI;
  long in_FS_OFFSET;
  int *in_stack_ffffffffffffffc8;
  QHash<int,_int> *in_stack_ffffffffffffffd8;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QHash<int,_int>::contains(in_stack_ffffffffffffffd8,(int *)in_RDI);
  if (!bVar1) {
    QHash<int,_int>::insert(in_RDI,in_stack_ffffffffffffffc8,(int *)0x845f7d);
    piVar2 = qMin<int>((int *)((long)&in_RDI[0xb7].d + 4),&local_c);
    *(int *)((long)&in_RDI[0xb7].d + 4) = *piVar2;
    piVar2 = qMax<int>((int *)(in_RDI + 0xb8),&local_c);
    *(int *)&in_RDI[0xb8].d = *piVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void saveCascadingSectionSize(int visual, int size) {
        if (!cascadingSectionSize.contains(visual)) {
            cascadingSectionSize.insert(visual, size);
            firstCascadingSection = qMin(firstCascadingSection, visual);
            lastCascadingSection = qMax(lastCascadingSection, visual);
        }
    }